

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O0

bool __thiscall ON_EmbeddedFile::Read(ON_EmbeddedFile *this,ON_BinaryArchive *archive)

{
  Data *sizeof__outbuffer;
  ON_wString this_00;
  bool bVar1;
  ON__UINT64 OVar2;
  pointer outbuffer;
  ON__UINT64 OVar3;
  ON__UINT64 pos_before;
  Data *pDStack_50;
  bool bFailedCRC;
  Data *d;
  size_t uncompressed_size;
  undefined4 local_38;
  ON_wString local_28;
  ON_wString filename;
  ON_BinaryArchive *archive_local;
  ON_EmbeddedFile *this_local;
  
  filename.m_s = (wchar_t *)archive;
  (*(this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[0x21])();
  ON_wString::ON_wString(&local_28);
  bVar1 = ON_BinaryArchive::ReadString((ON_BinaryArchive *)filename.m_s,&local_28);
  if (bVar1) {
    ON_wString::operator_cast_to_wchar_t_(&local_28);
    ON_FileSystemPath::CleanPath((wchar_t *)&uncompressed_size);
    ON_wString::operator=(&this->m_impl->m_orig_file,(ON_wString *)&uncompressed_size);
    ON_wString::~ON_wString((ON_wString *)&uncompressed_size);
    d = (Data *)0x0;
    bVar1 = ON_BinaryArchive::ReadCompressedBufferSize
                      ((ON_BinaryArchive *)filename.m_s,(size_t *)&d);
    if (bVar1) {
      pDStack_50 = &this->m_impl->m_data;
      CImpl::Data::SetLength(pDStack_50,(size_t)d);
      pos_before._7_1_ = 0;
      OVar2 = ON_BinaryArchive::CurrentPosition((ON_BinaryArchive *)filename.m_s);
      this_00 = filename;
      sizeof__outbuffer = d;
      outbuffer = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                            (&pDStack_50->m_buffer);
      bVar1 = ON_BinaryArchive::ReadCompressedBuffer
                        ((ON_BinaryArchive *)this_00.m_s,(size_t)sizeof__outbuffer,outbuffer,
                         (bool *)((long)&pos_before + 7));
      if ((bVar1) || ((pos_before._7_1_ & 1) != 0)) {
        OVar3 = ON_BinaryArchive::CurrentPosition((ON_BinaryArchive *)filename.m_s);
        pDStack_50->m_compressed_length = OVar3 - OVar2;
        this_local._7_1_ = true;
      }
      else {
        (this->m_impl->m_data).m_error = true;
        this_local._7_1_ = false;
      }
    }
    else {
      (this->m_impl->m_data).m_error = true;
      this_local._7_1_ = false;
    }
  }
  else {
    (this->m_impl->m_data).m_error = true;
    this_local._7_1_ = false;
  }
  local_38 = 1;
  ON_wString::~ON_wString(&local_28);
  return this_local._7_1_;
}

Assistant:

bool ON_EmbeddedFile::Read(ON_BinaryArchive& archive)
{
  Clear();

  // Read the full file path of the original file.
  ON_wString filename;
  if (!archive.ReadString(filename))
  {
    m_impl->m_data.m_error = true;
    return false;
  }

  m_impl->m_orig_file = ON_FileSystemPath::CleanPath(filename);

  // Read the original (uncompressed) size of the compressed buffer.
  size_t uncompressed_size = 0;
  if (!archive.ReadCompressedBufferSize(&uncompressed_size))
  {
    m_impl->m_data.m_error = true;
    return false;
  }

  // Allocate a buffer for the uncompressed data.
  auto& d = m_impl->m_data;
  d.SetLength(uncompressed_size);

  // Read the compressed buffer and uncompress it into uncompressed_buffer.
  bool bFailedCRC = false;

  const ON__UINT64 pos_before = archive.CurrentPosition();

  if (!archive.ReadCompressedBuffer(uncompressed_size, d.m_buffer.get(), &bFailedCRC) && !bFailedCRC)
  {
    m_impl->m_data.m_error = true;
    return false;
  }

  d.m_compressed_length = size_t(archive.CurrentPosition() - pos_before);

  return true;
}